

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcSymObjBase::fold_constant(CTcSymObjBase *this)

{
  tc_metaclass_t tVar1;
  CTcConstVal *val;
  CTcPrsNode *pCVar2;
  CTcSymObjBase *in_RDI;
  CTcConstVal cval;
  CTcConstVal *this_00;
  CTcConstVal local_38;
  CTcPrsNode *local_8;
  
  tVar1 = get_metaclass(in_RDI);
  if (tVar1 == TC_META_TADSOBJ) {
    this_00 = &local_38;
    CTcConstVal::CTcConstVal(this_00);
    val = (CTcConstVal *)get_obj_id(in_RDI);
    tVar1 = get_metaclass(in_RDI);
    CTcConstVal::set_obj(this_00,(ulong)val,tVar1);
    pCVar2 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2af28c);
    CTPNConst::CTPNConst((CTPNConst *)this_00,val);
    local_8 = pCVar2;
  }
  else {
    local_8 = (CTcPrsNode *)0x0;
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcSymObjBase::fold_constant()
{
    /* if it's not a TadsObject symbol, we can't fold it into a constant */
    if (get_metaclass() != TC_META_TADSOBJ)
        return 0;

    /* set up the object constant */
    CTcConstVal cval;
    cval.set_obj(get_obj_id(), get_metaclass());

    /* return a constant node */
    return new CTPNConst(&cval);
}